

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataStructures.pb.cc
# Opt level: O1

void __thiscall CoreML::Specification::Int64Vector::Int64Vector(Int64Vector *this,Int64Vector *from)

{
  int new_size;
  void *pvVar1;
  
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__Int64Vector_007200a0;
  (this->_internal_metadata_).
  super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
  .ptr_ = (void *)0x0;
  (this->vector_).current_size_ = 0;
  (this->vector_).total_size_ = 0;
  (this->vector_).rep_ = (Rep *)0x0;
  new_size = (from->vector_).current_size_;
  if (new_size != 0) {
    google::protobuf::RepeatedField<long>::Reserve(&this->vector_,new_size);
    memcpy(((this->vector_).rep_)->elements,((from->vector_).rep_)->elements,
           (long)(from->vector_).current_size_ << 3);
    (this->vector_).current_size_ = (from->vector_).current_size_;
  }
  this->_cached_size_ = 0;
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  return;
}

Assistant:

Int64Vector::Int64Vector(const Int64Vector& from)
  : ::google::protobuf::MessageLite(),
      _internal_metadata_(NULL),
      vector_(from.vector_),
      _cached_size_(0) {
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.Int64Vector)
}